

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_js_generator.cc
# Opt level: O0

void __thiscall
t_js_generator::generate_serialize_field
          (t_js_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  t_struct *ptVar1;
  t_field *ptVar2;
  uint uVar3;
  t_type *type_00;
  runtime_error *prVar4;
  string *psVar5;
  ulong uVar6;
  ostream *poVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [12];
  char *local_208;
  string local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  undefined1 local_129;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  t_base local_104;
  undefined1 local_100 [4];
  t_base tbase;
  undefined1 local_e0 [8];
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_7d;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  t_struct *local_30;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_js_generator *this_local;
  
  type = (t_type *)prefix;
  prefix_local = (string *)tfield;
  tfield_local = (t_field *)out;
  out_local = (ostream *)this;
  type_00 = t_field::get_type(tfield);
  local_30 = (t_struct *)t_generator::get_true_type(type_00);
  uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[4])();
  if ((uVar3 & 1) == 0) {
    uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xb])();
    if (((uVar3 & 1) == 0) &&
       (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar3 & 1) == 0)) {
      uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[0xd])();
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      if ((uVar3 & 1) == 0) {
        uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
        if (((uVar3 & 1) == 0) &&
           (uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])(), (uVar3 & 1) == 0)) {
          uVar8 = std::__cxx11::string::c_str();
          t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          uVar9 = std::__cxx11::string::c_str();
          (*(local_30->super_t_type).super_t_doc._vptr_t_doc[3])();
          uVar10 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",uVar8,uVar9,uVar10);
        }
        else {
          psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
          std::__cxx11::string::string((string *)local_e0,(string *)psVar5);
          uVar6 = std::__cxx11::string::empty();
          if ((uVar6 & 1) == 0) {
            psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_100,prefix,psVar5);
            std::__cxx11::string::operator=((string *)local_e0,(string *)local_100);
            std::__cxx11::string::~string((string *)local_100);
          }
          poVar7 = t_generator::indent((t_generator *)this,(ostream *)tfield_local);
          std::operator<<(poVar7,"output.");
          uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[5])();
          if ((uVar3 & 1) == 0) {
            uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[10])();
            if ((uVar3 & 1) != 0) {
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI32(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
            }
          }
          else {
            local_104 = t_base_type::get_base((t_base_type *)local_30);
            ptVar2 = tfield_local;
            switch(local_104) {
            case TYPE_VOID:
              local_129 = 1;
              prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_128,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_e0);
              std::runtime_error::runtime_error(prVar4,(string *)&local_128);
              local_129 = 0;
              __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            case TYPE_STRING:
              uVar3 = (*(local_30->super_t_type).super_t_doc._vptr_t_doc[7])();
              if ((uVar3 & 1) == 0) {
                local_208 = "writeString(";
              }
              else {
                local_208 = "writeBinary(";
              }
              poVar7 = std::operator<<((ostream *)ptVar2,local_208);
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_BOOL:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeBool(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_I8:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeByte(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_I16:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI16(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_I32:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI32(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_I64:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeI64(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            case TYPE_DOUBLE:
              poVar7 = std::operator<<((ostream *)tfield_local,"writeDouble(");
              poVar7 = std::operator<<(poVar7,(string *)local_e0);
              std::operator<<(poVar7,")");
              break;
            default:
              auVar11 = __cxa_allocate_exception(0x10);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_170,(t_base_type *)(ulong)local_104,auVar11._8_4_);
              std::operator+(&local_150,"compiler error: no JS name for base type ",&local_170);
              std::runtime_error::runtime_error(auVar11._0_8_,(string *)&local_150);
              __cxa_throw(auVar11._0_8_,&std::runtime_error::typeinfo,
                          std::runtime_error::~runtime_error);
            }
          }
          poVar7 = std::operator<<((ostream *)tfield_local,";");
          std::operator<<(poVar7,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)local_e0);
        }
      }
      else {
        psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
        __return_storage_ptr__ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&name.field_2 + 8);
        std::operator+(__return_storage_ptr__,prefix,psVar5);
        generate_serialize_container
                  (this,(ostream *)ptVar2,&ptVar1->super_t_type,__return_storage_ptr__);
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
    }
    else {
      ptVar2 = tfield_local;
      ptVar1 = local_30;
      psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
      std::operator+(&local_a0,prefix,psVar5);
      generate_serialize_struct(this,(ostream *)ptVar2,ptVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    return;
  }
  local_7d = 1;
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_70,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  psVar5 = t_field::get_name_abi_cxx11_((t_field *)prefix_local);
  std::operator+(&local_50,&local_70,psVar5);
  std::runtime_error::runtime_error(prVar4,(string *)&local_50);
  local_7d = 0;
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void t_js_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());

  // Do nothing for void types
  if (type->is_void()) {
    throw std::runtime_error("CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + tfield->get_name());
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + tfield->get_name());
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + tfield->get_name());
  } else if (type->is_base_type() || type->is_enum()) {

    string name = tfield->get_name();

    // Hack for when prefix is defined (always a hash ref)
    if (!prefix.empty())
      name = prefix + tfield->get_name();

    indent(out) << "output.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw std::runtime_error("compiler error: cannot serialize void field in a struct: " + name);
        break;
      case t_base_type::TYPE_STRING:
        out << (type->is_binary() ? "writeBinary(" : "writeString(") << name << ")";
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ")";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ")";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ")";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ")";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ")";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ")";
        break;
      default:
        throw std::runtime_error("compiler error: no JS name for base type " + t_base_type::t_base_name(tbase));
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ")";
    }
    out << ";" << endl;

  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           tfield->get_name().c_str(),
           type->get_name().c_str());
  }
}